

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_modifiers.cpp
# Opt level: O0

int32_t __thiscall
icu_63::number::impl::SimpleModifier::formatAsPrefixSuffix
          (SimpleModifier *this,NumberStringBuilder *result,int32_t startIndex,int32_t endIndex,
          Field field,UErrorCode *status)

{
  ssize_t sVar1;
  UErrorCode *status_local;
  Field field_local;
  int32_t endIndex_local;
  int32_t startIndex_local;
  NumberStringBuilder *result_local;
  SimpleModifier *this_local;
  
  if ((this->fSuffixOffset == -1) && (0 < this->fPrefixLength + this->fSuffixLength)) {
    sVar1 = NumberStringBuilder::splice
                      (result,startIndex,(__off64_t *)(ulong)(uint)endIndex,(int)this + 8,
                       (__off64_t *)0x2,(ulong)(this->fPrefixLength + 2),field);
    this_local._4_4_ = (int)sVar1;
  }
  else {
    if (0 < this->fPrefixLength) {
      NumberStringBuilder::insert
                (result,startIndex,&this->fCompiledPattern,2,this->fPrefixLength + 2,field,status);
    }
    if (0 < this->fSuffixLength) {
      NumberStringBuilder::insert
                (result,endIndex + this->fPrefixLength,&this->fCompiledPattern,
                 this->fSuffixOffset + 1,this->fSuffixOffset + 1 + this->fSuffixLength,field,status)
      ;
    }
    this_local._4_4_ = this->fPrefixLength + this->fSuffixLength;
  }
  return this_local._4_4_;
}

Assistant:

int32_t
SimpleModifier::formatAsPrefixSuffix(NumberStringBuilder &result, int32_t startIndex, int32_t endIndex,
                                     Field field, UErrorCode &status) const {
    if (fSuffixOffset == -1 && fPrefixLength + fSuffixLength > 0) {
        // There is no argument for the inner number; overwrite the entire segment with our string.
        return result.splice(startIndex, endIndex, fCompiledPattern, 2, 2 + fPrefixLength, field, status);
    } else {
        if (fPrefixLength > 0) {
            result.insert(startIndex, fCompiledPattern, 2, 2 + fPrefixLength, field, status);
        }
        if (fSuffixLength > 0) {
            result.insert(
                    endIndex + fPrefixLength,
                    fCompiledPattern,
                    1 + fSuffixOffset,
                    1 + fSuffixOffset + fSuffixLength,
                    field,
                    status);
        }
        return fPrefixLength + fSuffixLength;
    }
}